

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O1

void print_category(uint category,uint cols)

{
  char *__s;
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  helptxt *phVar5;
  ulong uVar6;
  ulong uVar7;
  
  pcVar4 = "    --abstract-unix-socket <path>";
  uVar6 = 5;
  uVar3 = 1;
  phVar5 = helptext;
  uVar7 = 5;
  do {
    if ((phVar5->categories & category) != 0) {
      sVar2 = strlen(pcVar4);
      if (uVar7 < sVar2) {
        uVar7 = sVar2;
      }
      sVar2 = strlen(phVar5->desc);
      if (uVar6 < sVar2) {
        uVar6 = sVar2;
      }
    }
    phVar5 = helptext + uVar3;
    pcVar4 = phVar5->opt;
    uVar3 = (ulong)((int)uVar3 + 1);
  } while (pcVar4 != (char *)0x0);
  uVar3 = cols - uVar6;
  if (uVar6 + uVar7 <= (ulong)cols) {
    uVar3 = uVar7;
  }
  pcVar4 = "    --abstract-unix-socket <path>";
  uVar6 = 1;
  phVar5 = helptext;
  do {
    if ((phVar5->categories & category) != 0) {
      __s = phVar5->desc;
      sVar2 = strlen(__s);
      uVar1 = (cols - 3) - (int)sVar2;
      if (cols - 2 <= sVar2) {
        uVar1 = 0;
      }
      uVar7 = uVar3 & 0xffffffff;
      if ((ulong)(cols - 2) <= sVar2 + uVar3) {
        uVar7 = (ulong)uVar1;
      }
      curl_mprintf(" %-*s  %s\n",uVar7,pcVar4,__s);
    }
    phVar5 = helptext + uVar6;
    pcVar4 = phVar5->opt;
    uVar6 = (ulong)((int)uVar6 + 1);
  } while (pcVar4 != (char *)0x0);
  return;
}

Assistant:

static void print_category(unsigned int category, unsigned int cols)
{
  unsigned int i;
  size_t longopt = 5;
  size_t longdesc = 5;

  for(i = 0; helptext[i].opt; ++i) {
    size_t len;
    if(!(helptext[i].categories & category))
      continue;
    len = strlen(helptext[i].opt);
    if(len > longopt)
      longopt = len;
    len = strlen(helptext[i].desc);
    if(len > longdesc)
      longdesc = len;
  }
  if(longopt + longdesc > cols)
    longopt = cols - longdesc;

  for(i = 0; helptext[i].opt; ++i)
    if(helptext[i].categories & category) {
      size_t opt = longopt;
      size_t desclen = strlen(helptext[i].desc);
      if(opt + desclen >= (cols - 2)) {
        if(desclen < (cols - 2))
          opt = (cols - 3) - desclen;
        else
          opt = 0;
      }
      printf(" %-*s  %s\n", (int)opt, helptext[i].opt, helptext[i].desc);
    }
}